

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2predicates.cc
# Opt level: O2

Excluded s2pred::GetVoronoiSiteExclusion
                   (S2Point *a,S2Point *b,S2Point *x0,S2Point *x1,S1ChordAngle r)

{
  bool bVar1;
  int iVar2;
  Excluded EVar3;
  S2Point *b_00;
  S1ChordAngle SVar4;
  undefined1 local_108 [16];
  longdouble local_f8;
  longdouble local_e8;
  double local_d0;
  ExactFloat local_c8;
  Vector3_xf local_b8;
  Vector3_xf local_88;
  Vector3_xf local_58;
  
  b_00 = x1;
  SVar4 = S1ChordAngle::Right();
  if (SVar4.length2_ <= r.length2_) {
    S2LogMessage::S2LogMessage
              ((S2LogMessage *)local_108,
               "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2predicates.cc"
               ,0x56b,kFatal,(ostream *)&std::cerr);
    std::operator<<((ostream *)CONCAT62(local_108._10_6_,local_108._8_2_),
                    "Check failed: (r) < (S1ChordAngle::Right()) ");
  }
  else {
    iVar2 = CompareDistances((s2pred *)x0,a,b,b_00);
    if (iVar2 < 0) {
      iVar2 = CompareEdgeDistance(a,x0,x1,r);
      if (iVar2 < 1) {
        iVar2 = CompareEdgeDistance(b,x0,x1,r);
        if (iVar2 < 1) {
          local_108._0_8_ = -x1->c_[0];
          local_108._10_6_ = (uint6)((ulong)x1->c_[1] >> 0x10) ^ 0x800000000000;
          local_108._8_2_ = SUB82(x1->c_[1],0);
          local_f8 = (longdouble)CONCAT28(local_f8._8_2_,-x1->c_[2]);
          bVar1 = util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::operator!=
                            ((BasicVector<Vector3,_double,_3UL> *)x0,(D *)local_108);
          if (bVar1) {
            iVar2 = CompareDistances((s2pred *)x1,a,b,b_00);
            if (iVar2 < 0) {
              EVar3 = SECOND;
            }
            else {
              EVar3 = TriageVoronoiSiteExclusion<double>(a,b,x0,x1,r.length2_);
              if (EVar3 == UNCERTAIN) {
                local_f8 = (longdouble)a->c_[1];
                local_e8 = (longdouble)a->c_[2];
                local_108._0_8_ = SUB108((longdouble)a->c_[0],0);
                local_108._8_2_ = (undefined2)((unkuint10)(longdouble)a->c_[0] >> 0x40);
                local_b8.c_[1]._0_10_ = (BADTYPE)b->c_[1];
                local_b8.c_[2]._0_10_ = (BADTYPE)b->c_[2];
                local_b8.c_[0]._0_8_ = SUB108((longdouble)b->c_[0],0);
                local_b8.c_[0].bn_.bn_._0_2_ = (undefined2)((unkuint10)(longdouble)b->c_[0] >> 0x40)
                ;
                local_58.c_[0]._0_10_ = (BADTYPE)x0->c_[0];
                local_58.c_[1]._0_10_ = (BADTYPE)x0->c_[1];
                local_58.c_[2]._0_10_ = (BADTYPE)x0->c_[2];
                local_88.c_[0]._0_10_ = (BADTYPE)x1->c_[0];
                local_88.c_[1]._0_10_ = (BADTYPE)x1->c_[1];
                local_88.c_[2]._0_10_ = (BADTYPE)x1->c_[2];
                local_d0 = r.length2_;
                EVar3 = TriageVoronoiSiteExclusion<long_double>
                                  ((Vector3<long_double> *)local_108,
                                   (Vector3<long_double> *)&local_b8,
                                   (Vector3<long_double> *)&local_58,
                                   (Vector3<long_double> *)&local_88,(longdouble)r.length2_);
                if (EVar3 == UNCERTAIN) {
                  util::math::internal_vector::BasicVector<Vector3,ExactFloat,3ul>::
                  GenerateEach<Vector3<ExactFloat>,0ul,1ul,2ul,util::math::internal_vector::BasicVector<Vector3,ExactFloat,3ul>::Cast<double>(Vector3<double>const&)::_lambda(double_const&)_1_,double_const>
                            (local_108,(BasicVector<Vector3,ExactFloat,3ul> *)a);
                  util::math::internal_vector::BasicVector<Vector3,ExactFloat,3ul>::
                  GenerateEach<Vector3<ExactFloat>,0ul,1ul,2ul,util::math::internal_vector::BasicVector<Vector3,ExactFloat,3ul>::Cast<double>(Vector3<double>const&)::_lambda(double_const&)_1_,double_const>
                            (&local_b8,(BasicVector<Vector3,ExactFloat,3ul> *)b);
                  util::math::internal_vector::BasicVector<Vector3,ExactFloat,3ul>::
                  GenerateEach<Vector3<ExactFloat>,0ul,1ul,2ul,util::math::internal_vector::BasicVector<Vector3,ExactFloat,3ul>::Cast<double>(Vector3<double>const&)::_lambda(double_const&)_1_,double_const>
                            (&local_58,(BasicVector<Vector3,ExactFloat,3ul> *)x0);
                  util::math::internal_vector::BasicVector<Vector3,ExactFloat,3ul>::
                  GenerateEach<Vector3<ExactFloat>,0ul,1ul,2ul,util::math::internal_vector::BasicVector<Vector3,ExactFloat,3ul>::Cast<double>(Vector3<double>const&)::_lambda(double_const&)_1_,double_const>
                            (&local_88,(BasicVector<Vector3,ExactFloat,3ul> *)x1);
                  ExactFloat::ExactFloat(&local_c8,r.length2_);
                  EVar3 = ExactVoronoiSiteExclusion
                                    ((Vector3_xf *)local_108,&local_b8,&local_58,&local_88,&local_c8
                                    );
                  ExactFloat::BigNum::~BigNum(&local_c8.bn_);
                  Vector3<ExactFloat>::~Vector3(&local_88);
                  Vector3<ExactFloat>::~Vector3(&local_58);
                  Vector3<ExactFloat>::~Vector3(&local_b8);
                  Vector3<ExactFloat>::~Vector3((Vector3<ExactFloat> *)local_108);
                }
              }
            }
            return EVar3;
          }
          S2LogMessage::S2LogMessage
                    ((S2LogMessage *)&local_b8,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2predicates.cc"
                     ,0x571,kFatal,(ostream *)&std::cerr);
          std::operator<<((ostream *)
                          CONCAT62(local_b8.c_[0].bn_.bn_._2_6_,local_b8.c_[0].bn_.bn_._0_2_),
                          "Check failed: (x0) != (-x1) ");
        }
        else {
          S2LogMessage::S2LogMessage
                    ((S2LogMessage *)local_108,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2predicates.cc"
                     ,0x56e,kFatal,(ostream *)&std::cerr);
          std::operator<<((ostream *)CONCAT62(local_108._10_6_,local_108._8_2_),
                          "Check failed: (s2pred::CompareEdgeDistance(b, x0, x1, r)) <= (0) ");
        }
      }
      else {
        S2LogMessage::S2LogMessage
                  ((S2LogMessage *)local_108,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2predicates.cc"
                   ,0x56d,kFatal,(ostream *)&std::cerr);
        std::operator<<((ostream *)CONCAT62(local_108._10_6_,local_108._8_2_),
                        "Check failed: (s2pred::CompareEdgeDistance(a, x0, x1, r)) <= (0) ");
      }
    }
    else {
      S2LogMessage::S2LogMessage
                ((S2LogMessage *)local_108,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2predicates.cc"
                 ,0x56c,kFatal,(ostream *)&std::cerr);
      std::operator<<((ostream *)CONCAT62(local_108._10_6_,local_108._8_2_),
                      "Check failed: (s2pred::CompareDistances(x0, a, b)) < (0) ");
    }
  }
  abort();
}

Assistant:

Excluded GetVoronoiSiteExclusion(const S2Point& a, const S2Point& b,
                                 const S2Point& x0, const S2Point& x1,
                                 S1ChordAngle r) {
  S2_DCHECK_LT(r, S1ChordAngle::Right());
  S2_DCHECK_LT(s2pred::CompareDistances(x0, a, b), 0);  // (implies a != b)
  S2_DCHECK_LE(s2pred::CompareEdgeDistance(a, x0, x1, r), 0);
  S2_DCHECK_LE(s2pred::CompareEdgeDistance(b, x0, x1, r), 0);
  // Check that the edge does not consist of antipodal points.  (This catches
  // the most common case -- the full test is in ExactVoronoiSiteExclusion.)
  S2_DCHECK_NE(x0, -x1);

  // If one site is closer than the other to both endpoints of X, then it is
  // closer to every point on X.  Note that this also handles the case where A
  // and B are equidistant from every point on X (i.e., X is the perpendicular
  // bisector of AB), because CompareDistances uses symbolic perturbations to
  // ensure that either A or B is considered closer (in a consistent way).
  // This also ensures that the choice of A or B does not depend on the
  // direction of X.
  if (s2pred::CompareDistances(x1, a, b) < 0) {
    return Excluded::SECOND;  // Site A is closer to every point on X.
  }

  Excluded result = TriageVoronoiSiteExclusion(a, b, x0, x1, r.length2());
  if (result != Excluded::UNCERTAIN) return result;

  result = TriageVoronoiSiteExclusion(ToLD(a), ToLD(b), ToLD(x0), ToLD(x1),
                                      ToLD(r.length2()));
  if (result != Excluded::UNCERTAIN) return result;

  return ExactVoronoiSiteExclusion(ToExact(a), ToExact(b), ToExact(x0),
                                   ToExact(x1), r.length2());
}